

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O3

Vec_Int_t * Iso_ManFinalize(Iso_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  Aig_Man_t *pAVar4;
  void **ppvVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  size_t __nmemb;
  
  if (p->nClasses != 0) {
    __assert_fail("p->nClasses == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                  ,0x444,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
  }
  if (p->vClasses->nSize != 0) {
    __assert_fail("Vec_PtrSize(p->vClasses) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                  ,0x445,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
  }
  pAVar4 = p->pAig;
  pVVar7 = pAVar4->vObjs;
  if (0 < pVVar7->nSize) {
    lVar3 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar3];
      if (pvVar2 != (void *)0x0) {
        uVar10 = (uint)*(undefined8 *)((long)pvVar2 + 0x18);
        if (((uVar10 & 7) == 2) || (0xfffffffd < (uVar10 & 7) - 7)) {
          iVar1 = *(int *)((long)pvVar2 + 0x24);
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                          ,300,"Iso_Obj_t *Iso_ManObj(Iso_Man_t *, int)");
          }
          iVar1 = p->pObjs[iVar1].Id;
          *(int *)((long)pvVar2 + 0x28) = iVar1;
          if (iVar1 < 1) {
            __assert_fail("pObj->iData > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                          ,0x44f,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
          }
        }
        else {
          *(undefined4 *)((long)pvVar2 + 0x28) = 0xffffffff;
        }
      }
      lVar3 = lVar3 + 1;
      pAVar4 = p->pAig;
      pVVar7 = pAVar4->vObjs;
    } while (lVar3 < pVVar7->nSize);
  }
  (pAVar4->pConst1->field_5).iData = 0;
  pVVar7 = p->vTemp1;
  pVVar7->nSize = 0;
  p->vTemp2->nSize = 0;
  pAVar4 = p->pAig;
  pVVar9 = pAVar4->vCis;
  if (0 < pVVar9->nSize) {
    lVar3 = 0;
    do {
      piVar6 = (int *)pVVar9->pArray[lVar3];
      if (piVar6[10] < 1) {
        __assert_fail("pObj->iData > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                      ,0x457,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
      }
      if (0xfffffffd < (piVar6[6] & 7U) - 7) goto LAB_00630ad5;
      if (*piVar6 < pAVar4->nObjs[2] - pAVar4->nRegs) {
        pVVar7 = p->vTemp1;
      }
      else {
        pVVar7 = p->vTemp2;
      }
      uVar10 = pVVar7->nSize;
      if (uVar10 == pVVar7->nCap) {
        if ((int)uVar10 < 0x10) {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar7->pArray,0x80);
          }
          pVVar7->pArray = ppvVar5;
          pVVar7->nCap = 0x10;
        }
        else {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar10 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar7->pArray,(ulong)uVar10 << 4);
          }
          pVVar7->pArray = ppvVar5;
          pVVar7->nCap = uVar10 * 2;
        }
      }
      else {
        ppvVar5 = pVVar7->pArray;
      }
      iVar1 = pVVar7->nSize;
      pVVar7->nSize = iVar1 + 1;
      ppvVar5[iVar1] = piVar6;
      lVar3 = lVar3 + 1;
      pAVar4 = p->pAig;
      pVVar9 = pAVar4->vCis;
    } while (lVar3 < pVVar9->nSize);
    pVVar7 = p->vTemp1;
  }
  if (1 < (long)pVVar7->nSize) {
    qsort(pVVar7->pArray,(long)pVVar7->nSize,8,Iso_ObjCompareByData);
  }
  __nmemb = (size_t)p->vTemp2->nSize;
  if (1 < (long)__nmemb) {
    qsort(p->vTemp2->pArray,__nmemb,8,Iso_ObjCompareByData);
  }
  iVar1 = p->pAig->nObjs[2];
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar8 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar8;
  if (iVar8 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar8 << 2);
  }
  p_00->pArray = piVar6;
  pVVar7 = p->vTemp1;
  if (0 < pVVar7->nSize) {
    lVar3 = 0;
    do {
      if (0xfffffffd < (*(uint *)((long)pVVar7->pArray[lVar3] + 0x18) & 7) - 7) goto LAB_00630ad5;
      Vec_IntPush(p_00,*pVVar7->pArray[lVar3]);
      lVar3 = lVar3 + 1;
      pVVar7 = p->vTemp1;
    } while (lVar3 < pVVar7->nSize);
  }
  pVVar7 = p->vTemp2;
  if (0 < pVVar7->nSize) {
    lVar3 = 0;
    do {
      if (0xfffffffd < (*(uint *)((long)pVVar7->pArray[lVar3] + 0x18) & 7) - 7) {
LAB_00630ad5:
        __assert_fail("!Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
      }
      Vec_IntPush(p_00,*pVVar7->pArray[lVar3]);
      lVar3 = lVar3 + 1;
      pVVar7 = p->vTemp2;
    } while (lVar3 < pVVar7->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Iso_ManFinalize( Iso_Man_t * p )
{
    Vec_Int_t * vRes;
    Aig_Obj_t * pObj;
    int i;
    assert( p->nClasses == 0 );
    assert( Vec_PtrSize(p->vClasses) == 0 );
    // set canonical numbers
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
        {
            pObj->iData = -1;
            continue;
        }
        pObj->iData = Iso_ManObj(p, Aig_ObjId(pObj))->Id;
        assert( pObj->iData > 0 );
    }
    Aig_ManConst1(p->pAig)->iData = 0;
    // assign unique IDs to the CIs
    Vec_PtrClear( p->vTemp1 );
    Vec_PtrClear( p->vTemp2 );
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        assert( pObj->iData > 0 );
        if ( Aig_ObjCioId(pObj) >= Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig) ) // flop
            Vec_PtrPush( p->vTemp2, pObj );
        else // PI
            Vec_PtrPush( p->vTemp1, pObj );
    }
    // sort CIs by their IDs
    Vec_PtrSort( p->vTemp1, (int (*)(void))Iso_ObjCompareByData );
    Vec_PtrSort( p->vTemp2, (int (*)(void))Iso_ObjCompareByData );
    // create the result
    vRes = Vec_IntAlloc( Aig_ManCiNum(p->pAig) );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTemp1, pObj, i )
        Vec_IntPush( vRes, Aig_ObjCioId(pObj) );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTemp2, pObj, i )
        Vec_IntPush( vRes, Aig_ObjCioId(pObj) );
    return vRes;
}